

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTPNCodeBody * __thiscall CTPNCodeBodyBase::get_outermost_enclosing(CTPNCodeBodyBase *this)

{
  CTPNCodeBodyBase *in_RDI;
  CTPNCodeBody *nxt;
  CTPNCodeBody *cur;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = (CTPNCodeBody *)0x0;
  for (local_18 = get_enclosing(in_RDI); local_18 != (CTPNCodeBody *)0x0;
      local_18 = get_enclosing(&local_18->super_CTPNCodeBodyBase)) {
    local_10 = local_18;
  }
  return local_10;
}

Assistant:

CTPNCodeBody *CTPNCodeBodyBase::get_outermost_enclosing() const
{
    CTPNCodeBody *cur;
    CTPNCodeBody *nxt;

    /* 
     *   scan each enclosing code body until we find one without an enclosing
     *   code body 
     */
    for (cur = 0, nxt = get_enclosing() ; nxt != 0 ;
         cur = nxt, nxt = nxt->get_enclosing()) ;

    /* return what we found */
    return cur;
}